

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O2

void __thiscall
glu::SubTypeIterator<glu::IsBasicType>::findNext(SubTypeIterator<glu::IsBasicType> *this)

{
  int *piVar1;
  TypeComponentVector *path;
  pointer pVVar2;
  VarType curType;
  VarTypeComponent local_40;
  VarType local_38;
  
  pVVar2 = (this->m_path).
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if ((this->m_path).
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start != pVVar2) {
    piVar1 = &pVVar2[-1].index;
    *piVar1 = *piVar1 + 1;
  }
  path = &this->m_path;
  do {
    getVarType(&local_38,this->m_type,path);
    if (local_38.m_type == TYPE_ARRAY) {
      local_40.type = ARRAY_ELEMENT;
      local_40.index = 0;
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      emplace_back<glu::VarTypeComponent>(path,&local_40);
    }
    else if (local_38.m_type == TYPE_STRUCT) {
      local_40.type = STRUCT_MEMBER;
      local_40.index = 0;
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      emplace_back<glu::VarTypeComponent>(path,&local_40);
    }
    else if (local_38.m_type == TYPE_BASIC) {
      VarType::~VarType(&local_38);
      return;
    }
    VarType::~VarType(&local_38);
  } while( true );
}

Assistant:

void SubTypeIterator<IsExpanded>::findNext (void)
{
	if (!m_path.empty())
	{
		// Increment child counter in current level.
		VarTypeComponent& curComp = m_path.back();
		curComp.index += 1;
	}

	for (;;)
	{
		VarType curType = getVarType(*m_type, m_path);

		if (IsExpanded()(curType))
			break;

		// Recurse into child type.
		if (curType.isBasicType())
		{
			DataType basicType = curType.getBasicType();

			if (isDataTypeMatrix(basicType))
				m_path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, 0));
			else if (isDataTypeVector(basicType))
				m_path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, 0));
			else
				DE_ASSERT(false); // Can't expand scalars - IsExpanded() is buggy.
		}
		else if (curType.isArrayType())
			m_path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, 0));
		else if (curType.isStructType())
			m_path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, 0));
		else
			DE_ASSERT(false);
	}
}